

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20240722::debugging_internal::ParseType(State *state)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  bool bVar4;
  bool result_1;
  bool result;
  ParseState copy;
  ComplexityGuard local_20;
  ComplexityGuard guard;
  State *state_local;
  
  guard.state_ = state;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_20,state);
  bVar4 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_20);
  if (bVar4) {
    state_local._7_1_ = false;
  }
  else {
    uVar1 = ((guard.state_)->parse_state).mangled_idx;
    uVar2 = ((guard.state_)->parse_state).out_cur_idx;
    uVar3 = *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx;
    bVar4 = ParseCVQualifiers(guard.state_);
    if (bVar4) {
      state_local._7_1_ = ParseType(guard.state_);
      if (!state_local._7_1_) {
        ((guard.state_)->parse_state).mangled_idx = uVar1;
        ((guard.state_)->parse_state).out_cur_idx = uVar2;
        *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar3;
      }
    }
    else {
      ((guard.state_)->parse_state).mangled_idx = uVar1;
      ((guard.state_)->parse_state).out_cur_idx = uVar2;
      *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar3;
      bVar4 = ParseCharClass(guard.state_,"OPRCG");
      if (bVar4) {
        state_local._7_1_ = ParseType(guard.state_);
        if (!state_local._7_1_) {
          ((guard.state_)->parse_state).mangled_idx = uVar1;
          ((guard.state_)->parse_state).out_cur_idx = uVar2;
          *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar3;
        }
      }
      else {
        ((guard.state_)->parse_state).mangled_idx = uVar1;
        ((guard.state_)->parse_state).out_cur_idx = uVar2;
        *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar3;
        bVar4 = ParseTwoCharToken(guard.state_,"Dp");
        if ((bVar4) && (bVar4 = ParseType(guard.state_), bVar4)) {
          state_local._7_1_ = true;
        }
        else {
          ((guard.state_)->parse_state).mangled_idx = uVar1;
          ((guard.state_)->parse_state).out_cur_idx = uVar2;
          *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar3;
          bVar4 = ParseBuiltinType(guard.state_);
          if (((((bVar4) || (bVar4 = ParseFunctionType(guard.state_), bVar4)) ||
               (bVar4 = ParseClassEnumType(guard.state_), bVar4)) ||
              ((bVar4 = ParseArrayType(guard.state_), bVar4 ||
               (bVar4 = ParsePointerToMemberType(guard.state_), bVar4)))) ||
             ((bVar4 = ParseDecltype(guard.state_), bVar4 ||
              (bVar4 = ParseSubstitution(guard.state_,false), bVar4)))) {
            state_local._7_1_ = true;
          }
          else {
            bVar4 = ParseTemplateTemplateParam(guard.state_);
            if ((bVar4) && (bVar4 = ParseTemplateArgs(guard.state_), bVar4)) {
              state_local._7_1_ = true;
            }
            else {
              ((guard.state_)->parse_state).mangled_idx = uVar1;
              ((guard.state_)->parse_state).out_cur_idx = uVar2;
              *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar3;
              bVar4 = ParseTemplateParam(guard.state_);
              if (bVar4) {
                state_local._7_1_ = true;
              }
              else {
                bVar4 = ParseTwoCharToken(guard.state_,"Dv");
                if ((((bVar4) && (bVar4 = ParseNumber(guard.state_,(int *)0x0), bVar4)) &&
                    (bVar4 = ParseOneCharToken(guard.state_,'_'), bVar4)) &&
                   (bVar4 = ParseType(guard.state_), bVar4)) {
                  state_local._7_1_ = true;
                }
                else {
                  ((guard.state_)->parse_state).mangled_idx = uVar1;
                  ((guard.state_)->parse_state).out_cur_idx = uVar2;
                  *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar3;
                  bVar4 = ParseTwoCharToken(guard.state_,"Dv");
                  if (((bVar4) && (bVar4 = ParseExpression(guard.state_), bVar4)) &&
                     ((bVar4 = ParseOneCharToken(guard.state_,'_'), bVar4 &&
                      (bVar4 = ParseType(guard.state_), bVar4)))) {
                    state_local._7_1_ = true;
                  }
                  else {
                    ((guard.state_)->parse_state).mangled_idx = uVar1;
                    ((guard.state_)->parse_state).out_cur_idx = uVar2;
                    *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar3;
                    bVar4 = ParseTwoCharToken(guard.state_,"Dk");
                    if ((bVar4) && (bVar4 = ParseTypeConstraint(guard.state_), bVar4)) {
                      state_local._7_1_ = true;
                    }
                    else {
                      ((guard.state_)->parse_state).mangled_idx = uVar1;
                      ((guard.state_)->parse_state).out_cur_idx = uVar2;
                      *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar3;
                      state_local._7_1_ = ParseLongToken(guard.state_,"_SUBSTPACK_");
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_20);
  return state_local._7_1_;
}

Assistant:

static bool ParseType(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;

  // We should check CV-qualifers, and PRGC things first.
  //
  // CV-qualifiers overlap with some operator names, but an operator name is not
  // valid as a type.  To avoid an ambiguity that can lead to exponential time
  // complexity, refuse to backtrack the CV-qualifiers.
  //
  // _Z4aoeuIrMvvE
  //  => _Z 4aoeuI        rM  v     v   E
  //         aoeu<operator%=, void, void>
  //  => _Z 4aoeuI r Mv v              E
  //         aoeu<void void::* restrict>
  //
  // By consuming the CV-qualifiers first, the former parse is disabled.
  if (ParseCVQualifiers(state)) {
    const bool result = ParseType(state);
    if (!result) state->parse_state = copy;
    return result;
  }
  state->parse_state = copy;

  // Similarly, these tag characters can overlap with other <name>s resulting in
  // two different parse prefixes that land on <template-args> in the same
  // place, such as "C3r1xI...".  So, disable the "ctor-name = C3" parse by
  // refusing to backtrack the tag characters.
  if (ParseCharClass(state, "OPRCG")) {
    const bool result = ParseType(state);
    if (!result) state->parse_state = copy;
    return result;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "Dp") && ParseType(state)) {
    return true;
  }
  state->parse_state = copy;

  if (ParseBuiltinType(state) || ParseFunctionType(state) ||
      ParseClassEnumType(state) || ParseArrayType(state) ||
      ParsePointerToMemberType(state) || ParseDecltype(state) ||
      // "std" on its own isn't a type.
      ParseSubstitution(state, /*accept_std=*/false)) {
    return true;
  }

  if (ParseTemplateTemplateParam(state) && ParseTemplateArgs(state)) {
    return true;
  }
  state->parse_state = copy;

  // Less greedy than <template-template-param> <template-args>.
  if (ParseTemplateParam(state)) {
    return true;
  }

  // GNU vector extension Dv <number> _ <type>
  if (ParseTwoCharToken(state, "Dv") && ParseNumber(state, nullptr) &&
      ParseOneCharToken(state, '_') && ParseType(state)) {
    return true;
  }
  state->parse_state = copy;

  // GNU vector extension Dv <expression> _ <type>
  if (ParseTwoCharToken(state, "Dv") && ParseExpression(state) &&
      ParseOneCharToken(state, '_') && ParseType(state)) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "Dk") && ParseTypeConstraint(state)) {
    return true;
  }
  state->parse_state = copy;

  // For this notation see CXXNameMangler::mangleType in Clang's source code.
  // The relevant logic and its comment "not clear how to mangle this!" date
  // from 2011, so it may be with us awhile.
  return ParseLongToken(state, "_SUBSTPACK_");
}